

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void search_filter_ref(AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *this_rdc,
                      InterPredParams *inter_pred_params_sr,int mi_row,int mi_col,
                      PRED_BUFFER *tmp_buffer,BLOCK_SIZE bsize,int reuse_inter_pred,
                      PRED_BUFFER **this_mode_pred,int *this_early_term,uint *var,
                      int use_model_yrd_large,int64_t best_sse,int is_single_pred)

{
  int iVar1;
  undefined4 *in_RDX;
  long in_RSI;
  long in_RDI;
  SubpelParams *in_stack_00000008;
  byte in_stack_00000010;
  int in_stack_00000018;
  long *in_stack_00000020;
  int *in_stack_00000028;
  undefined4 *in_stack_00000030;
  int in_stack_00000038;
  MACROBLOCKD *in_stack_00000040;
  uint curr_var;
  int64_t cost;
  int filter_idx;
  SubpelParams subpel_params;
  int best_filter_index;
  int64_t best_cost;
  int best_early_term;
  int best_skip;
  PRED_BUFFER *current_pred;
  TX_SIZE pf_tx_size [4];
  RD_STATS pf_rd_stats [4];
  int dim_factor;
  int bw;
  MB_MODE_INFO *mi;
  macroblockd_plane *pd;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  MACROBLOCKD *in_stack_00000e10;
  MACROBLOCK *in_stack_00000e18;
  int in_stack_00000e24;
  int in_stack_00000e28;
  BLOCK_SIZE in_stack_00000e2f;
  AV1_COMP *in_stack_00000e30;
  RD_STATS *in_stack_00000e60;
  int *in_stack_00000e68;
  int in_stack_00000e70;
  int64_t in_stack_00000e78;
  uint *in_stack_00000e80;
  uint in_stack_00000e88;
  scale_factors *in_stack_fffffffffffffe78;
  SubpelParams *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  MACROBLOCKD *in_stack_fffffffffffffe90;
  MACROBLOCK *in_stack_fffffffffffffe98;
  bool local_151;
  SubpelParams *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  MACROBLOCKD *in_stack_fffffffffffffec0;
  int iVar2;
  undefined4 in_stack_fffffffffffffecc;
  AV1_COMMON *in_stack_fffffffffffffed0;
  MACROBLOCKD *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int iVar3;
  MACROBLOCKD *pMVar4;
  int iVar5;
  uint uVar6;
  PRED_BUFFER *local_108;
  int in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  int local_58;
  uint local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  undefined4 *local_20;
  long local_18;
  long local_10;
  
  local_38 = in_RDI + 0x3bf80;
  local_40 = in_RSI + 0x1a0;
  local_48 = in_RSI + 0x1b0;
  local_50 = **(long **)(in_RSI + 0x2058);
  local_54 = (uint)block_size_wide[in_stack_00000010];
  local_58 = 1;
  if (*(int *)(in_RDI + 0x60b44) == 0) {
    local_58 = 2;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&stack0xffffffffffffff08,0,0xa0);
  memset(&stack0xffffffffffffff04,0,4);
  local_108 = (PRED_BUFFER *)*in_stack_00000020;
  uVar6 = 0;
  iVar5 = 0;
  pMVar4 = (MACROBLOCKD *)0x7fffffffffffffff;
  iVar3 = -1;
  if ((int)cost != 0) {
    init_inter_mode_params
              ((MV *)in_stack_fffffffffffffe90,
               (InterPredParams *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,0,0x2e98c8);
  }
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    if ((*(int *)(local_10 + 0x60b44) == 0) ||
       (*(uint16_t *)((long)filters_ref_set + (long)iVar2 * 4 + 2) ==
        filters_ref_set[iVar2].as_filters.y_filter)) {
      *(int_interpfilters *)(local_50 + 0x14) = filters_ref_set[iVar2];
      if ((int)cost == 0) {
        av1_enc_build_inter_predictor
                  (in_stack_fffffffffffffed0,
                   (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffecc,iVar2),
                   (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(int)in_stack_fffffffffffffec0,
                   (BUFFER_SET *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (BLOCK_SIZE)((ulong)in_stack_fffffffffffffeb0 >> 0x38),in_stack_fffffffffffffee0,
                   (int)pMVar4);
      }
      else {
        av1_enc_build_inter_predictor_y_nonrd
                  (in_stack_fffffffffffffec0,
                   (InterPredParams *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   in_stack_fffffffffffffeb0);
      }
      in_stack_fffffffffffffebc = 0xffffffff;
      if (in_stack_00000038 == 0) {
        model_rd_for_sb_y((AV1_COMP *)CONCAT44(uVar6,iVar5),(BLOCK_SIZE)((ulong)pMVar4 >> 0x38),
                          (MACROBLOCK *)CONCAT44(iVar3,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8,(RD_STATS *)in_stack_fffffffffffffed0,
                          (uint *)CONCAT44(in_stack_fffffffffffffecc,iVar2),
                          in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
      }
      else {
        in_stack_fffffffffffffe98 = (MACROBLOCK *)&stack0xfffffffffffffebc;
        in_stack_fffffffffffffe88 = 1;
        in_stack_fffffffffffffe90 = in_stack_00000040;
        model_skip_for_sb_y_large
                  (in_stack_00000e30,in_stack_00000e2f,in_stack_00000e28,in_stack_00000e24,
                   in_stack_00000e18,in_stack_00000e10,in_stack_00000e60,in_stack_00000e68,
                   in_stack_00000e70,in_stack_00000e78,in_stack_00000e80,in_stack_00000e88);
      }
      iVar1 = av1_get_switchable_rate
                        (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                         (InterpFilter)((uint)in_stack_fffffffffffffe8c >> 0x18),
                         in_stack_fffffffffffffe88);
      *(int *)(&stack0xffffffffffffff08 + (long)iVar2 * 0x28) =
           iVar1 + *(int *)(&stack0xffffffffffffff08 + (long)iVar2 * 0x28);
      in_stack_fffffffffffffec0 =
           (MACROBLOCKD *)
           (((long)*(int *)(&stack0xffffffffffffff08 + (long)iVar2 * 0x28) *
             (long)*(int *)(local_18 + 0x4218) + 0x100 >> 9) +
           *(long *)(&stack0xffffffffffffff10 + (long)iVar2 * 0x28) * 0x80);
      (&stack0xffffffffffffff04)[iVar2] = *(undefined1 *)(local_50 + 0x91);
      if ((long)in_stack_fffffffffffffec0 < (long)pMVar4) {
        *in_stack_00000030 = in_stack_fffffffffffffebc;
        uVar6 = (uint)(byte)(&stack0xffffffffffffff28)[(long)iVar2 * 0x28];
        iVar5 = *in_stack_00000028;
        iVar3 = iVar2;
        pMVar4 = in_stack_fffffffffffffec0;
        if (in_stack_00000018 != 0) {
          if ((PRED_BUFFER *)*in_stack_00000020 != local_108) {
            free_pred_buffer((PRED_BUFFER *)*in_stack_00000020);
            *in_stack_00000020 = (long)local_108;
          }
          in_stack_fffffffffffffeb0 = in_stack_00000008;
          iVar1 = get_pred_buffer((PRED_BUFFER *)in_stack_00000008,3);
          local_108 = (PRED_BUFFER *)((long)&in_stack_fffffffffffffeb0->xs + (long)iVar1 * 2 * 8);
          *(uint8_t **)(local_48 + 0x10) = local_108->data;
          *(uint *)(local_48 + 0x28) = local_54;
        }
      }
    }
  }
  if ((in_stack_00000018 != 0) && ((PRED_BUFFER *)*in_stack_00000020 != local_108)) {
    free_pred_buffer(local_108);
  }
  *(int_interpfilters *)(local_50 + 0x14) = filters_ref_set[iVar3];
  *(undefined1 *)(local_50 + 0x91) = (&stack0xffffffffffffff04)[iVar3];
  *local_20 = *(undefined4 *)(&stack0xffffffffffffff08 + (long)iVar3 * 0x28);
  *(undefined8 *)(local_20 + 2) = *(undefined8 *)(&stack0xffffffffffffff10 + (long)iVar3 * 0x28);
  *(undefined8 *)(local_20 + 6) = *(undefined8 *)(&stack0xffffffffffffff20 + (long)iVar3 * 0x28);
  local_151 = uVar6 != 0 || iVar5 != 0;
  *(bool *)(local_20 + 8) = local_151;
  *in_stack_00000028 = iVar5;
  if (in_stack_00000018 == 0) {
    if (iVar3 < local_58 * 2 + -1) {
      if ((int)cost == 0) {
        av1_enc_build_inter_predictor
                  (in_stack_fffffffffffffed0,
                   (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffecc,iVar2),
                   (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(int)in_stack_fffffffffffffec0,
                   (BUFFER_SET *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (BLOCK_SIZE)((ulong)in_stack_fffffffffffffeb0 >> 0x38),in_stack_fffffffffffffee0,
                   (int)pMVar4);
      }
      else {
        av1_enc_build_inter_predictor_y_nonrd
                  (in_stack_fffffffffffffec0,
                   (InterPredParams *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   in_stack_fffffffffffffeb0);
      }
    }
  }
  else {
    *(undefined8 *)(local_48 + 0x10) = *(undefined8 *)*in_stack_00000020;
    *(undefined4 *)(local_48 + 0x28) = *(undefined4 *)(*in_stack_00000020 + 8);
  }
  return;
}

Assistant:

static void search_filter_ref(AV1_COMP *cpi, MACROBLOCK *x, RD_STATS *this_rdc,
                              InterPredParams *inter_pred_params_sr, int mi_row,
                              int mi_col, PRED_BUFFER *tmp_buffer,
                              BLOCK_SIZE bsize, int reuse_inter_pred,
                              PRED_BUFFER **this_mode_pred,
                              int *this_early_term, unsigned int *var,
                              int use_model_yrd_large, int64_t best_sse,
                              int is_single_pred) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  MB_MODE_INFO *const mi = xd->mi[0];
  const int bw = block_size_wide[bsize];
  int dim_factor =
      (cpi->sf.interp_sf.disable_dual_filter == 0) ? FILTER_SEARCH_SIZE : 1;
  RD_STATS pf_rd_stats[FILTER_SEARCH_SIZE * FILTER_SEARCH_SIZE] = { 0 };
  TX_SIZE pf_tx_size[FILTER_SEARCH_SIZE * FILTER_SEARCH_SIZE] = { 0 };
  PRED_BUFFER *current_pred = *this_mode_pred;
  int best_skip = 0;
  int best_early_term = 0;
  int64_t best_cost = INT64_MAX;
  int best_filter_index = -1;

  SubpelParams subpel_params;
  // Initialize inter prediction params at mode level for single reference
  // mode.
  if (is_single_pred)
    init_inter_mode_params(&mi->mv[0].as_mv, inter_pred_params_sr,
                           &subpel_params, xd->block_ref_scale_factors[0],
                           pd->pre->width, pd->pre->height);
  for (int filter_idx = 0; filter_idx < FILTER_SEARCH_SIZE * FILTER_SEARCH_SIZE;
       ++filter_idx) {
    int64_t cost;
    if (cpi->sf.interp_sf.disable_dual_filter &&
        filters_ref_set[filter_idx].as_filters.x_filter !=
            filters_ref_set[filter_idx].as_filters.y_filter)
      continue;

    mi->interp_filters.as_int = filters_ref_set[filter_idx].as_int;
    if (is_single_pred)
      av1_enc_build_inter_predictor_y_nonrd(xd, inter_pred_params_sr,
                                            &subpel_params);
    else
      av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                    AOM_PLANE_Y, AOM_PLANE_Y);
    unsigned int curr_var = UINT_MAX;
    if (use_model_yrd_large)
      model_skip_for_sb_y_large(cpi, bsize, mi_row, mi_col, x, xd,
                                &pf_rd_stats[filter_idx], this_early_term, 1,
                                best_sse, &curr_var, UINT_MAX);
    else
      model_rd_for_sb_y(cpi, bsize, x, xd, &pf_rd_stats[filter_idx], &curr_var,
                        1, NULL);
    pf_rd_stats[filter_idx].rate += av1_get_switchable_rate(
        x, xd, cm->features.interp_filter, cm->seq_params->enable_dual_filter);
    cost = RDCOST(x->rdmult, pf_rd_stats[filter_idx].rate,
                  pf_rd_stats[filter_idx].dist);
    pf_tx_size[filter_idx] = mi->tx_size;
    if (cost < best_cost) {
      *var = curr_var;
      best_filter_index = filter_idx;
      best_cost = cost;
      best_skip = pf_rd_stats[filter_idx].skip_txfm;
      best_early_term = *this_early_term;
      if (reuse_inter_pred) {
        if (*this_mode_pred != current_pred) {
          free_pred_buffer(*this_mode_pred);
          *this_mode_pred = current_pred;
        }
        current_pred = &tmp_buffer[get_pred_buffer(tmp_buffer, 3)];
        pd->dst.buf = current_pred->data;
        pd->dst.stride = bw;
      }
    }
  }
  assert(best_filter_index >= 0 &&
         best_filter_index < dim_factor * FILTER_SEARCH_SIZE);
  if (reuse_inter_pred && *this_mode_pred != current_pred)
    free_pred_buffer(current_pred);

  mi->interp_filters.as_int = filters_ref_set[best_filter_index].as_int;
  mi->tx_size = pf_tx_size[best_filter_index];
  this_rdc->rate = pf_rd_stats[best_filter_index].rate;
  this_rdc->dist = pf_rd_stats[best_filter_index].dist;
  this_rdc->sse = pf_rd_stats[best_filter_index].sse;
  this_rdc->skip_txfm = (best_skip || best_early_term);
  *this_early_term = best_early_term;
  if (reuse_inter_pred) {
    pd->dst.buf = (*this_mode_pred)->data;
    pd->dst.stride = (*this_mode_pred)->stride;
  } else if (best_filter_index < dim_factor * FILTER_SEARCH_SIZE - 1) {
    if (is_single_pred)
      av1_enc_build_inter_predictor_y_nonrd(xd, inter_pred_params_sr,
                                            &subpel_params);
    else
      av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                    AOM_PLANE_Y, AOM_PLANE_Y);
  }
}